

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O3

void CF_MEMTRACE_MALLOC(void *p,cf_size_t size,cf_char_t *file,cf_char_t *function,int line)

{
  undefined8 *value;
  cf_size_t cVar1;
  cf_char_t *pcVar2;
  cf_size_t cVar3;
  void *local_38;
  
  if (g_memchk_ctx.inited != 0) {
    local_38 = p;
    cf_mutex_lock(&g_memchk_ctx.mutex);
    g_memchk_ctx.alloc_size = g_memchk_ctx.alloc_size + size;
    value = (undefined8 *)calloc(1,0x120);
    cVar1 = cf_strlen(file);
    pcVar2 = (cf_char_t *)calloc(1,cVar1 + 1);
    *value = pcVar2;
    cf_strcpy_s(pcVar2,cVar1 + 1,file);
    cVar1 = cf_strlen(function);
    cVar3 = cf_strlen(function);
    pcVar2 = (cf_char_t *)calloc(1,cVar3 + 1);
    value[1] = pcVar2;
    cf_strcpy_s(pcVar2,cVar1 + 1,function);
    *(int *)(value + 2) = line;
    value[3] = size;
    cf_hashtbl_set(g_memchk_ctx.alloc_info,&local_38,8,value);
    cf_mutex_unlock(&g_memchk_ctx.mutex);
  }
  return;
}

Assistant:

void CF_MEMTRACE_MALLOC(void* p, cf_size_t size,
                        const cf_char_t* file,
                        const cf_char_t* function,
                        int line) {
    malloc_info* info;
    cf_size_t len;
    if (!g_memchk_ctx.inited) return;

    /* printf("ALLOC p: %p, size: %ld, file: %s, func: %s, line: %d\n", p, size, file, function, line); */

    cf_mutex_lock(&g_memchk_ctx.mutex);

    g_memchk_ctx.alloc_size += size;

    /**
     * fill the malloc info and add to hashtbl
     * use the allocated address as the key, eg:
     * void* p = malloc(size);
     * p is 0x12345678, then key is:
     * char key[] = {0x12, 0x34, 0x56, 0x78};
     * int keylen = sizeof(void*);
     */
    {
        info = cf_malloc_z_native(sizeof(malloc_info));

        len = cf_strlen(file);
        info->location.file_name = cf_malloc_z_native(len + 1);
        cf_strcpy_s((char*)info->location.file_name, len + 1, file);

        len = cf_strlen(function);
        info->location.function_name = cf_malloc_z_native(cf_strlen(function) + 1);
        cf_strcpy_s((char*)info->location.function_name, len + 1, function);

        info->location.line_number = line;
        info->size = size;


#ifdef _WIN32
        if (g_current_process == 0) {
            g_current_process = GetCurrentProcess();
            SymInitialize(g_current_process, NULL, TRUE);
        }
        void* stack[10];
        DWORD frames = CaptureStackBackTrace(2, 5, stack, NULL);
        DWORD i;
        for (i = 0; i < frames; i++) {
            DWORD64 addr = (DWORD64)stack[i];
            PSYMBOL_INFO sym_info = cf_malloc_native(sizeof(SYMBOL_INFO) + 64);
            sym_info->SizeOfStruct = sizeof(SYMBOL_INFO);
            sym_info->MaxNameLen = 64;
            DWORD64 displacement_sym = 0;
            if (SymFromAddr(g_current_process, addr, &displacement_sym, sym_info)) {
                cf_snprintf(info->info, sizeof(info->info) - cf_strlen(info->info),
                    "%s<-%s", info->info, sym_info->Name);
                    //SymGetLineFromAddr()
            }
            cf_free_native(sym_info);
        }
#endif
    }
    cf_hashtbl_set(g_memchk_ctx.alloc_info, &p, sizeof(void*), (cf_void_t*)info);

    cf_mutex_unlock(&g_memchk_ctx.mutex);
}